

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::TextureUnitCase::iterate(TextureUnitCase *this)

{
  MultiTexShader *this_00;
  undefined8 log_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int z_;
  RenderContext *context_00;
  undefined4 extraout_var;
  GLenum *pGVar8;
  reference pvVar9;
  reference pvVar10;
  reference ppTVar11;
  reference ppTVar12;
  reference ppTVar13;
  reference ppTVar14;
  PixelFormat *pPVar15;
  char *description;
  undefined1 local_6570 [3];
  bool isOk;
  float threshold;
  MultisamplePixelBufferAccess local_6548;
  MultisamplePixelBufferAccess local_6520;
  ReferenceContextLimits local_64f8;
  undefined1 local_64a0 [8];
  ReferenceContext context_1;
  undefined1 local_2e0 [8];
  ReferenceContextBuffers buffers;
  undefined1 local_258 [8];
  GLContext context;
  Vector<int,_3> local_e0;
  Vector<int,_3> local_d4;
  Vector<int,_3> local_c8;
  Vector<int,_3> local_bc;
  value_type local_b0;
  int local_ac;
  GLenum type;
  int texNdxInType;
  int texNdx;
  int i;
  vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> texSizes;
  Surface refFrame;
  Surface gles3Frame;
  int viewportY;
  int viewportX;
  int viewportHeight;
  undefined1 local_38 [4];
  int viewportWidth;
  Random rnd;
  TestLog *log;
  RenderTarget *renderTarget;
  RenderContext *renderCtx;
  TextureUnitCase *this_local;
  RenderTarget *this_01;
  
  context_00 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*context_00->_vptr_RenderContext[4])();
  this_01 = (RenderTarget *)CONCAT44(extraout_var,iVar2);
  rnd.m_rnd._8_8_ =
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  de::Random::Random((Random *)local_38,this->m_randSeed);
  iVar2 = tcu::RenderTarget::getWidth(this_01);
  iVar2 = ::deMin32(0x80,iVar2);
  iVar3 = tcu::RenderTarget::getHeight(this_01);
  iVar3 = ::deMin32(0x80,iVar3);
  iVar4 = tcu::RenderTarget::getWidth(this_01);
  iVar4 = de::Random::getInt((Random *)local_38,0,iVar4 - iVar2);
  iVar5 = tcu::RenderTarget::getHeight(this_01);
  iVar5 = de::Random::getInt((Random *)local_38,0,iVar5 - iVar3);
  tcu::Surface::Surface((Surface *)&refFrame.m_pixels.m_cap,iVar2,iVar3);
  tcu::Surface::Surface
            ((Surface *)
             &texSizes.
              super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,iVar2,iVar3);
  std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::vector
            ((vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *)&texNdx);
  std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::reserve
            ((vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *)&texNdx,
             (long)this->m_numUnits);
  for (texNdxInType = 0; texNdxInType < this->m_numUnits; texNdxInType = texNdxInType + 1) {
    pGVar8 = (GLenum *)
             std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_unitTextures,(long)texNdxInType);
    type = *pGVar8;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_ndxTexType,(long)(int)type)
    ;
    local_ac = *pvVar9;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->m_textureTypes,(long)(int)type);
    local_b0 = *pvVar10;
    if (local_b0 == 0xde1) {
      ppTVar11 = std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::operator[]
                           (&this->m_textures2d,(long)local_ac);
      iVar6 = tcu::Texture2D::getWidth(*ppTVar11);
      ppTVar11 = std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::operator[]
                           (&this->m_textures2d,(long)local_ac);
      iVar7 = tcu::Texture2D::getHeight(*ppTVar11);
      tcu::Vector<int,_3>::Vector(&local_bc,iVar6,iVar7,0);
      std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::push_back
                ((vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *)&texNdx,
                 &local_bc);
    }
    else if (local_b0 == 0x806f) {
      ppTVar14 = std::vector<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>::operator[]
                           (&this->m_textures3d,(long)local_ac);
      iVar6 = tcu::Texture3D::getWidth(*ppTVar14);
      ppTVar14 = std::vector<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>::operator[]
                           (&this->m_textures3d,(long)local_ac);
      iVar7 = tcu::Texture3D::getHeight(*ppTVar14);
      ppTVar14 = std::vector<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>::operator[]
                           (&this->m_textures3d,(long)local_ac);
      z_ = tcu::Texture3D::getDepth(*ppTVar14);
      tcu::Vector<int,_3>::Vector(&local_e0,iVar6,iVar7,z_);
      std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::push_back
                ((vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *)&texNdx,
                 &local_e0);
    }
    else if (local_b0 == 0x8513) {
      ppTVar12 = std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::operator[]
                           (&this->m_texturesCube,(long)local_ac);
      iVar6 = tcu::TextureCube::getSize(*ppTVar12);
      ppTVar12 = std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::operator[]
                           (&this->m_texturesCube,(long)local_ac);
      iVar7 = tcu::TextureCube::getSize(*ppTVar12);
      tcu::Vector<int,_3>::Vector(&local_c8,iVar6,iVar7,0);
      std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::push_back
                ((vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *)&texNdx,
                 &local_c8);
    }
    else if (local_b0 == 0x8c1a) {
      ppTVar13 = std::vector<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>::
                 operator[](&this->m_textures2dArray,(long)local_ac);
      iVar6 = tcu::Texture2DArray::getWidth(*ppTVar13);
      ppTVar13 = std::vector<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>::
                 operator[](&this->m_textures2dArray,(long)local_ac);
      iVar7 = tcu::Texture2DArray::getHeight(*ppTVar13);
      tcu::Vector<int,_3>::Vector(&local_d4,iVar6,iVar7,0);
      std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::push_back
                ((vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *)&texNdx,
                 &local_d4);
    }
  }
  this_00 = this->m_shader;
  tcu::Vector<int,_2>::Vector
            ((Vector<int,_2> *)
             &context.m_programs.
              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,iVar2,iVar3);
  MultiTexShader::makeSafeLods
            (this_00,(vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *)&texNdx,
             (IVec2 *)&context.m_programs.
                       super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::~vector
            ((vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *)&texNdx);
  log_00 = rnd.m_rnd._8_8_;
  tcu::Vector<int,_4>::Vector
            ((Vector<int,_4> *)&buffers.m_stencilbuffer.m_data.m_cap,iVar4,iVar5,iVar2,iVar3);
  sglr::GLContext::GLContext
            ((GLContext *)local_258,context_00,(TestLog *)log_00,3,
             (IVec4 *)&buffers.m_stencilbuffer.m_data.m_cap);
  render(this,(Context *)local_258);
  sglr::Context::readPixels
            ((Context *)local_258,(Surface *)&refFrame.m_pixels.m_cap,0,0,iVar2,iVar3);
  sglr::GLContext::~GLContext((GLContext *)local_258);
  pPVar15 = tcu::RenderTarget::getPixelFormat(this_01);
  tcu::PixelFormat::PixelFormat
            ((PixelFormat *)
             &context_1.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,8,8,8,(uint)(pPVar15->alphaBits != 0) << 3);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            ((ReferenceContextBuffers *)local_2e0,
             (PixelFormat *)
             &context_1.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,0,iVar2,iVar3,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits(&local_64f8,context_00);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_6520,(ReferenceContextBuffers *)local_2e0);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_6548,(ReferenceContextBuffers *)local_2e0);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)local_6570,(ReferenceContextBuffers *)local_2e0);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)local_64a0,&local_64f8,&local_6520,&local_6548,
             (MultisamplePixelBufferAccess *)local_6570);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_64f8);
  render(this,(Context *)local_64a0);
  sglr::Context::readPixels
            ((Context *)local_64a0,
             (Surface *)
             &texSizes.
              super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,0,0,iVar2,iVar3);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_64a0);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers((ReferenceContextBuffers *)local_2e0);
  bVar1 = tcu::fuzzyCompare((TestLog *)rnd.m_rnd._8_8_,"ComparisonResult","Image comparison result",
                            (Surface *)
                            &texSizes.
                             super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (Surface *)&refFrame.m_pixels.m_cap,0.001,COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar1 & QP_TEST_RESULT_FAIL,description);
  tcu::Surface::~Surface
            ((Surface *)
             &texSizes.
              super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface((Surface *)&refFrame.m_pixels.m_cap);
  de::Random::~Random((Random *)local_38);
  return STOP;
}

Assistant:

TextureUnitCase::IterateResult TextureUnitCase::iterate (void)
{
	glu::RenderContext&			renderCtx			= m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget		= renderCtx.getRenderTarget();
	tcu::TestLog&				log					= m_testCtx.getLog();
	de::Random					rnd					(m_randSeed);

	int							viewportWidth		= deMin32(VIEWPORT_WIDTH, renderTarget.getWidth());
	int							viewportHeight		= deMin32(VIEWPORT_HEIGHT, renderTarget.getHeight());
	int							viewportX			= rnd.getInt(0, renderTarget.getWidth() - viewportWidth);
	int							viewportY			= rnd.getInt(0, renderTarget.getHeight() - viewportHeight);

	tcu::Surface				gles3Frame			(viewportWidth, viewportHeight);
	tcu::Surface				refFrame			(viewportWidth, viewportHeight);

	{
		// First we do some tricks to make the LODs safer wrt. precision issues. See MultiTexShader::makeSafeLods().

		vector<IVec3> texSizes;
		texSizes.reserve(m_numUnits);

		for (int i = 0; i < m_numUnits; i++)
		{
			int		texNdx			= m_unitTextures[i];
			int		texNdxInType	= m_ndxTexType[texNdx];
			GLenum	type			= m_textureTypes[texNdx];

			switch (type)
			{
				case GL_TEXTURE_2D:			texSizes.push_back(IVec3(m_textures2d[texNdxInType]->getWidth(),		m_textures2d[texNdxInType]->getHeight(),		0));										break;
				case GL_TEXTURE_CUBE_MAP:	texSizes.push_back(IVec3(m_texturesCube[texNdxInType]->getSize(),		m_texturesCube[texNdxInType]->getSize(),		0));										break;
				case GL_TEXTURE_2D_ARRAY:	texSizes.push_back(IVec3(m_textures2dArray[texNdxInType]->getWidth(),	m_textures2dArray[texNdxInType]->getHeight(),	0));										break;
				case GL_TEXTURE_3D:			texSizes.push_back(IVec3(m_textures3d[texNdxInType]->getWidth(),		m_textures3d[texNdxInType]->getHeight(),		m_textures3d[texNdxInType]->getDepth()));	break;
				default:
					DE_ASSERT(DE_FALSE);
			}
		}

		m_shader->makeSafeLods(texSizes, IVec2(viewportWidth, viewportHeight));
	}

	// Render using GLES3.
	{
		sglr::GLContext context(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS|sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(viewportX, viewportY, viewportWidth, viewportHeight));

		render(context);

		context.readPixels(gles3Frame, 0, 0, viewportWidth, viewportHeight);
	}

	// Render reference image.
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), 0 /* depth */, 0 /* stencil */, viewportWidth, viewportHeight);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		render(context);

		context.readPixels(refFrame, 0, 0, viewportWidth, viewportHeight);
	}

	// Compare images.
	const float		threshold	= 0.001f;
	bool			isOk		= tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, gles3Frame, threshold, tcu::COMPARE_LOG_RESULT);

	// Store test result.
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}